

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader14.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader14::begin__init_from____fx_surface_init_from_common
          (LibraryEffectsLoader14 *this,
          init_from____fx_surface_init_from_common__AttributeData *attributeData)

{
  int iVar1;
  undefined8 local_10;
  ENUM__fx_surface_face_enum local_8;
  
  local_10._0_4_ = attributeData->mip;
  local_10._4_4_ = attributeData->slice;
  if (attributeData->face < 8) {
    local_8 = attributeData->face;
  }
  iVar1 = (*(this->mLoader->super_LibraryImagesLoader).super_FilePartLoader.super_IFilePartLoader.
            super_ExtraDataLoader._vptr_ExtraDataLoader[0x22])(this->mLoader,&local_10);
  return SUB41(iVar1,0);
}

Assistant:

bool LibraryEffectsLoader14::begin__init_from____fx_surface_init_from_common( const COLLADASaxFWL14::init_from____fx_surface_init_from_common__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__init_from____fx_surface_init_from_common(attributeData));
COLLADASaxFWL::init_from____fx_surface_init_from_common__AttributeData attrData;
attrData.mip = attributeData.mip;
attrData.slice = attributeData.slice;
switch (attributeData.face) {
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__POSITIVE_X: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__POSITIVE_X; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__NEGATIVE_X: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__NEGATIVE_X; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__POSITIVE_Y: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__POSITIVE_Y; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__NEGATIVE_Y: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__NEGATIVE_Y; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__POSITIVE_Z: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__POSITIVE_Z; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__NEGATIVE_Z: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__NEGATIVE_Z; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__COUNT: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__INVALID; break;
case COLLADASaxFWL14::ENUM__fx_surface_face_enum__NOT_PRESENT: attrData.face=COLLADASaxFWL::ENUM__fx_surface_face__NOT_PRESENT; break;
}
return mLoader->begin__init_from____fx_surface_init_from_common(attrData);
}